

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::doRun
          (ExplicitUniformLocationCaseBase *this,
          vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          *uniforms,
          vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          *subroutineUniforms,string *additionalDef,bool negativeCompile,bool negativeLink)

{
  CallLogWrapper *this_00;
  __aligned_membuf<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_> *__x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x_00;
  undefined1 *puVar1;
  GLenum GVar2;
  GLsizei width;
  pointer pcVar3;
  _Alloc_hider _Var4;
  _Base_ptr p_Var5;
  TestLog *this_01;
  undefined8 uVar6;
  pointer pCVar7;
  GLint GVar8;
  bool bVar9;
  bool bVar10;
  GLuint GVar11;
  ContextType type;
  uint uVar12;
  uint uVar13;
  GLuint GVar14;
  pointer pSVar15;
  iterator iVar16;
  ostream *poVar17;
  _Link_type p_Var18;
  _Rb_tree_node_base *p_Var20;
  _Base_ptr p_Var21;
  pointer pCVar22;
  pointer pCVar23;
  SubroutineFunction *this_02;
  GLenum *pGVar24;
  pointer puVar25;
  float *pfVar26;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ulong uVar27;
  undefined1 *puVar28;
  pointer pSVar29;
  pointer pvVar30;
  _Rb_tree_header *p_Var31;
  undefined1 *puVar32;
  _Rb_tree_header *p_Var33;
  allocator_type *__a;
  allocator_type *__a_00;
  ShaderKey *extraout_RDX;
  ShaderKey *__y;
  ShaderKey *extraout_RDX_00;
  ShaderKey *__y_00;
  ShaderKey *__y_01;
  _Rb_tree_node_base *extraout_RDX_01;
  _Rb_tree_node_base *extraout_RDX_02;
  _Rb_tree_node_base *extraout_RDX_03;
  _Rb_tree_node_base *extraout_RDX_04;
  uint *__args;
  pointer pUVar34;
  int iVar35;
  _Self __tmp;
  ulong uVar36;
  pointer pCVar37;
  uint __tmp_6;
  long lVar38;
  ShaderKey *__x_01;
  __aligned_membuf<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_> *__x_02;
  pointer pCVar39;
  CompiledProgram *pCVar40;
  char *__p;
  _Link_type p_Var41;
  _Link_type p_Var42;
  SubroutineUniform *pSVar43;
  pointer pSVar44;
  int iVar45;
  _Link_type p_Var46;
  byte bVar47;
  GLenum GVar48;
  ulong uVar49;
  ulong uVar50;
  undefined1 auVar51 [16];
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar52;
  ulong local_16d0;
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  programConfigs;
  ulong local_1690;
  ulong local_1688;
  uint __tmp_4;
  map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
  shaders;
  vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  programs;
  ulong local_1610;
  GLuint vao;
  GLuint vbo;
  size_type __dnew;
  pointer puStack_15f0;
  pointer local_15e8;
  ulong local_15e0;
  int local_15d4;
  GLint maxIndex;
  GLint maxLocation;
  string parentUniformName;
  size_type __dnew_1;
  undefined1 local_1580 [24];
  _Base_ptr local_1568;
  size_t local_1560;
  ostringstream name_1;
  GLfloat coords [16];
  ostringstream name;
  _Link_type p_Var19;
  
  parentUniformName._M_dataplus._M_p = (pointer)&parentUniformName.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&parentUniformName,0x1b32ab9);
  if ((uniforms->
      super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (uniforms->
      super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    lVar38 = 0;
    uVar49 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"u",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&name);
      pUVar34 = (uniforms->
                super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::stringbuf::str();
      Uniform::setName((Uniform *)((long)&(pUVar34->type).enumType + lVar38),&parentUniformName,
                       (string *)&name_1);
      if (name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream,
                        name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      std::ios_base::~ios_base
                ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      uVar49 = uVar49 + 1;
      lVar38 = lVar38 + 0x1d8;
    } while (uVar49 < (ulong)(((long)(uniforms->
                                     super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(uniforms->
                                     super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x34115b1e5f75270d));
  }
  if ((subroutineUniforms->
      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (subroutineUniforms->
      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_16d0 = 0;
    iVar45 = 0;
    iVar35 = 0;
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name_1,"u",1);
      std::ostream::_M_insert<unsigned_long>((ulong)&name_1);
      pSVar29 = (subroutineUniforms->
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&pSVar29[local_16d0].name);
      if (name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
          (_func_int **)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
        operator_delete(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                        name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
      }
      pSVar29 = (subroutineUniforms->
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (pSVar29[local_16d0].functions.typeName._M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"st",2);
        std::ostream::operator<<((ostringstream *)&name,iVar35);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=
                  ((string *)&pSVar29[local_16d0].functions.typeName,(string *)&__dnew_1);
        if ((undefined1 *)__dnew_1 != local_1580 + 8) {
          operator_delete((void *)__dnew_1,local_1580._8_8_ + 1);
        }
        iVar35 = iVar35 + 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        std::ios_base::~ios_base
                  ((ios_base *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
        pSVar29 = (subroutineUniforms->
                  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pSVar44 = *(pointer *)
                   &pSVar29[local_16d0].functions.fn.
                    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
        ;
        if (pSVar29[local_16d0].functions.fn.
            super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
            ._M_impl.super__Vector_impl_data._M_finish != pSVar44) {
          lVar38 = 0xe8;
          uVar49 = 0;
          do {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&name,"sf",2);
            std::ostream::operator<<((ostringstream *)&name,iVar45 + (int)uVar49);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=
                      ((string *)((long)&(pSVar44->index).super_LayoutSpecifierBase.val + lVar38),
                       (string *)&__dnew_1);
            if ((undefined1 *)__dnew_1 != local_1580 + 8) {
              operator_delete((void *)__dnew_1,local_1580._8_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            uVar49 = uVar49 + 1;
            pSVar29 = (subroutineUniforms->
                      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pSVar44 = *(pointer *)
                       &pSVar29[local_16d0].functions.fn.
                        super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
            ;
            lVar38 = lVar38 + 0x108;
          } while (uVar49 < (ulong)(((long)pSVar29[local_16d0].functions.fn.
                                           super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar44 >> 3) * 0xf83e0f83e0f83e1));
          iVar45 = iVar45 + (int)uVar49;
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_1);
      std::ios_base::~ios_base
                ((ios_base *)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
      local_16d0 = local_16d0 + 1;
    } while (local_16d0 <
             (ulong)(((long)(subroutineUniforms->
                            super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(subroutineUniforms->
                            super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4fa4fa4fa4fa4fa5));
  }
  coords[0xc] = -1.0;
  coords[0xd] = 1.0;
  coords[0xe] = 0.0;
  coords[0xf] = 1.0;
  coords[8] = -1.0;
  coords[9] = -1.0;
  coords[10] = 0.0;
  coords[0xb] = 1.0;
  coords._16_8_ = &DAT_3f8000003f800000;
  coords[6] = 0.0;
  coords[7] = 1.0;
  coords[0] = 1.0;
  coords[1] = -1.0;
  coords[2] = 0.0;
  coords[3] = 1.0;
  this_00 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&vbo);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,vbo);
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x40,coords,0x88e4);
  glu::CallLogWrapper::glGenVertexArrays(this_00,1,&vao);
  glu::CallLogWrapper::glBindVertexArray(this_00,vao);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
  programs.
  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  programs.
  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  programs.
  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  programConfigs.
  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  programConfigs.
  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  programConfigs.
  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
  ::vector((vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
            *)&shaders,2,__a);
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
       name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ & 0xffffffffffffff00;
  puVar28 = local_1580 + 8;
  __dnew = 0x13;
  __dnew_1 = (size_type)puVar28;
  __dnew_1 = std::__cxx11::string::_M_create(&__dnew_1,(ulong)&__dnew);
  local_1580._8_8_ = __dnew;
  builtin_strncpy((char *)__dnew_1,"vs_ValidationResult",0x13);
  local_1580._0_8_ = __dnew;
  *(char *)(__dnew_1 + __dnew) = '\0';
  ShaderKey::ShaderKey((ShaderKey *)&name,0x8b31,(string *)&name_1,(string *)&__dnew_1);
  uVar6 = shaders._M_t._M_impl._0_8_;
  *(GLuint *)shaders._M_t._M_impl._0_8_ =
       (GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  std::__cxx11::string::operator=
            ((string *)(shaders._M_t._M_impl._0_8_ + 8),
             (string *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  std::__cxx11::string::operator=
            ((string *)(uVar6 + 0x28),
             (string *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x28);
  puVar32 = &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x38;
  if ((undefined1 *)name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != puVar32) {
    operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_,
                    name.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ + 1);
  }
  puVar1 = &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x18;
  if ((undefined1 *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != puVar1) {
    operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                    name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ + 1);
  }
  if ((undefined1 *)__dnew_1 != puVar28) {
    operator_delete((void *)__dnew_1,local_1580._8_8_ + 1);
  }
  if (name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  __dnew_1 = 0x13;
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)std::__cxx11::string::_M_create((ulong *)&name_1,(ulong)&__dnew_1);
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = __dnew_1;
  *name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int *)0x64696c61565f7376;
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[1] =
       (_func_int *)0x7365526e6f697461;
  builtin_strncpy((char *)((long)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream + 0xf),"sult",4);
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = __dnew_1;
  *(char *)((long)name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream +
           __dnew_1) = '\0';
  local_1580._0_8_ = (_func_int **)0x0;
  local_1580._8_8_ = local_1580._8_8_ & 0xffffffffffffff00;
  __dnew_1 = (size_type)puVar28;
  ShaderKey::ShaderKey((ShaderKey *)&name,0x8b30,(string *)&name_1,(string *)&__dnew_1);
  *(GLuint *)(uVar6 + 0x48) =
       (GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  std::__cxx11::string::operator=
            ((string *)(uVar6 + 0x50),
             (string *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  std::__cxx11::string::operator=
            ((string *)(uVar6 + 0x70),
             (string *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x28);
  if ((undefined1 *)name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != puVar32) {
    operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_,
                    name.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ + 1);
  }
  if ((undefined1 *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != puVar1) {
    operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                    name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ + 1);
  }
  if ((undefined1 *)__dnew_1 != puVar28) {
    operator_delete((void *)__dnew_1,local_1580._8_8_ + 1);
  }
  if (name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  std::
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ::push_back(&programConfigs,(value_type *)&shaders);
  std::
  vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
  ::~vector((vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
             *)&shaders);
  std::
  vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
  ::vector((vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
            *)&shaders,1,__a_00);
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
       (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
  name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
       name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ & 0xffffffffffffff00;
  local_1580._0_8_ = (_func_int **)0x0;
  local_1580._8_8_ = local_1580._8_8_ & 0xffffffffffffff00;
  __dnew_1 = (size_type)puVar28;
  ShaderKey::ShaderKey((ShaderKey *)&name,0x91b9,(string *)&name_1,(string *)&__dnew_1);
  uVar6 = shaders._M_t._M_impl._0_8_;
  *(GLuint *)shaders._M_t._M_impl._0_8_ =
       (GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
  std::__cxx11::string::operator=
            ((string *)(shaders._M_t._M_impl._0_8_ + 8),
             (string *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
  std::__cxx11::string::operator=
            ((string *)(uVar6 + 0x28),
             (string *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x28);
  if ((undefined1 *)name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ != puVar32) {
    operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_,
                    name.super_basic_ostream<char,_std::char_traits<char>_>._56_8_ + 1);
  }
  if ((undefined1 *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != puVar1) {
    operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                    name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ + 1);
  }
  if ((undefined1 *)__dnew_1 != puVar28) {
    operator_delete((void *)__dnew_1,(ulong)(local_1580._8_8_ + 1));
  }
  if (name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
      (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
    operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream,
                    name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
  }
  __p = (char *)&shaders;
  std::
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ::push_back(&programConfigs,(value_type *)__p);
  std::
  vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
  ::~vector((vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
             *)&shaders);
  shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &shaders._M_t._M_impl.super__Rb_tree_header._M_header;
  shaders._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       (ulong)(uint)shaders._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
  shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var20 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (programConfigs.
      super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      programConfigs.
      super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar49 = 0;
    do {
      pSVar15 = programConfigs.
                super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar49].
                super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (programConfigs.
          super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar49].
          super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
          ._M_impl.super__Vector_impl_data._M_finish != pSVar15) {
        uVar36 = 0;
        do {
          __p = (char *)(pSVar15 + uVar36);
          iVar16 = std::
                   map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                   ::find(&shaders,(key_type *)__p);
          pvVar30 = programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var31 = &shaders._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)iVar16._M_node == p_Var31) {
            GVar11 = glu::CallLogWrapper::glCreateShader
                               (this_00,programConfigs.
                                        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar49].
                                        super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar36].stage);
            pSVar15 = pvVar30[uVar49].
                      super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar36;
            type.super_ApiType.m_bits =
                 (ApiType)(*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                            _vptr_RenderContext[2])();
            GVar2 = pSVar15->stage;
            if (GVar2 == 0x8b30) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
              ShaderSourceFactory::streamShaderHeader(&name,type);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamUniformDefinitions(uniforms,0x8b30,&name);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamSubroutineDefinitions(subroutineUniforms,0x8b30,&name);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (additionalDef->_M_dataplus)._M_p,additionalDef->_M_string_length
                                  );
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\nin vec4 ",9);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar17,(pSVar15->input)._M_dataplus._M_p,
                                   (pSVar15->input)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,";",1);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,"\nout vec4 out_FragColor;",0x18);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\nvoid main() {",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,"\n    vec4 validationResult = ",0x1d);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar17,(pSVar15->input)._M_dataplus._M_p,
                                   (pSVar15->input)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,";",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
              ShaderSourceFactory::streamUniformValidators(&name,uniforms,0x8b30,(char *)p_Var31);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamSubroutineValidators
                        (&name,subroutineUniforms,0x8b30,(char *)p_Var31);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\n    out_FragColor =  validationResult;",0x27);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n}",2);
              std::__cxx11::stringbuf::str();
            }
            else if (GVar2 == 0x91b9) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
              ShaderSourceFactory::streamShaderHeader(&name,type);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\nlayout (local_size_x = 1, local_size_y = 1) in;",0x30);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\nlayout (std430, binding = 1) buffer ResultBuffer {",0x33);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\n    vec4 cs_ValidationResult;",0x1e);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n};",3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamUniformDefinitions(uniforms,0x91b9,&name);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamSubroutineDefinitions(subroutineUniforms,0x91b9,&name);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (additionalDef->_M_dataplus)._M_p,additionalDef->_M_string_length
                                  );
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\nvoid main() {",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,"\n    vec4 validationResult = vec4(0.0, 1.0, 0.0, 1.0);",0x36);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
              ShaderSourceFactory::streamUniformValidators(&name,uniforms,0x91b9,(char *)p_Var31);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamSubroutineValidators
                        (&name,subroutineUniforms,0x91b9,(char *)p_Var31);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                         "\n    cs_ValidationResult =  validationResult;",0x2d);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n}",2);
              std::__cxx11::stringbuf::str();
            }
            else {
              if (GVar2 != 0x8b31) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                              ,0x4b4,
                              "static std::string glcts::(anonymous namespace)::ShaderSourceFactory::generateShader(const ShaderKey &, const std::vector<Uniform> &, const std::vector<SubroutineUniform> &, const std::string &, const glu::ContextType)"
                             );
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
              ShaderSourceFactory::streamShaderHeader(&name,type);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamUniformDefinitions(uniforms,0x8b31,&name);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamSubroutineDefinitions(subroutineUniforms,0x8b31,&name);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (additionalDef->_M_dataplus)._M_p,additionalDef->_M_string_length
                                  );
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,"\nin vec4 in_Position;",0x15);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\nout vec4 ",10);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar17,(pSVar15->output)._M_dataplus._M_p,
                                   (pSVar15->output)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,";",1);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\nvoid main() {",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,"\n    vec4 validationResult = vec4(0.0, 1.0, 0.0, 1.0);",0x36);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n",1);
              ShaderSourceFactory::streamUniformValidators(&name,uniforms,0x8b31,(char *)p_Var31);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
              ShaderSourceFactory::streamSubroutineValidators
                        (&name,subroutineUniforms,0x8b31,(char *)p_Var31);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&name.super_basic_ostream<char,_std::char_traits<char>_>,"\n    ",5);
              poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>,
                                   (pSVar15->output)._M_dataplus._M_p,
                                   (pSVar15->output)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17," = validationResult;",0x14);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar17,"\n    gl_Position = in_Position;",0x1f);
              std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\n}",2);
              std::__cxx11::stringbuf::str();
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
            std::ios_base::~ios_base
                      ((ios_base *)
                       &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
            name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
            glu::CallLogWrapper::glShaderSource(this_00,GVar11,1,(GLchar **)&name,(GLint *)0x0);
            __x_01 = pvVar30[uVar49].
                     super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar36;
            p_Var46 = (_Link_type)&shaders._M_t._M_impl.super__Rb_tree_header;
            __y = extraout_RDX;
            for (p_Var18 = (_Link_type)
                           shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var18 != (_Link_type)0x0;
                p_Var18 = *(_Link_type *)
                           ((p_Var18->_M_storage)._M_storage + (ulong)bVar9 * 8 + -0x10)) {
              bVar9 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                ((less<glcts::(anonymous_namespace)::ShaderKey> *)
                                 &p_Var18->_M_storage,__x_01,__y);
              if (!bVar9) {
                p_Var46 = p_Var18;
              }
              __y = extraout_RDX_00;
            }
            if (p_Var46 == (_Link_type)&shaders._M_t._M_impl.super__Rb_tree_header) {
LAB_00bbba6a:
              p_Var18 = (_Link_type)operator_new(0x70);
              *(GLenum *)(p_Var18->_M_storage)._M_storage = __x_01->stage;
              *(uchar **)((p_Var18->_M_storage)._M_storage + 8) =
                   (p_Var18->_M_storage)._M_storage + 0x18;
              pcVar3 = (__x_01->input)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)((p_Var18->_M_storage)._M_storage + 8),pcVar3,
                         pcVar3 + (__x_01->input)._M_string_length);
              *(uchar **)((p_Var18->_M_storage)._M_storage + 0x28) =
                   (p_Var18->_M_storage)._M_storage + 0x38;
              pcVar3 = (__x_01->output)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)((p_Var18->_M_storage)._M_storage + 0x28),pcVar3,
                         pcVar3 + (__x_01->output)._M_string_length);
              __x_02 = &p_Var18->_M_storage;
              (p_Var18->_M_storage)._M_storage[0x48] = '\0';
              (p_Var18->_M_storage)._M_storage[0x49] = '\0';
              (p_Var18->_M_storage)._M_storage[0x4a] = '\0';
              (p_Var18->_M_storage)._M_storage[0x4b] = '\0';
              if (p_Var46 == (_Link_type)&shaders._M_t._M_impl.super__Rb_tree_header) {
                if ((shaders._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
                   (__p = (char *)__x_02,
                   bVar9 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                     ((less<glcts::(anonymous_namespace)::ShaderKey> *)
                                      (shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                                      + 1),(ShaderKey *)__x_02,__y_00), p_Var20 = extraout_RDX_02,
                   !bVar9)) {
LAB_00bbbbc2:
                  __p = (char *)__x_02;
                  pVar52 = std::
                           _Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                           ::_M_get_insert_unique_pos(&shaders._M_t,(key_type *)__x_02);
                  p_Var41 = (_Link_type)pVar52.second;
                }
                else {
LAB_00bbbbb3:
                  auVar51._8_8_ = 0;
                  auVar51._0_8_ = p_Var20;
                  pVar52 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)
                           (auVar51 << 0x40);
                  p_Var41 = (_Link_type)
                            shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
                }
              }
              else {
                __x = &p_Var46->_M_storage;
                __p = (char *)__x;
                bVar9 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                  ((less<glcts::(anonymous_namespace)::ShaderKey> *)__x_02,
                                   (ShaderKey *)__x,__y_00);
                if (bVar9) {
                  pVar52.second = (_Rb_tree_node_base *)__y_01;
                  pVar52.first = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  p_Var41 = (_Link_type)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                  ;
                  if ((_Link_type)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
                      p_Var46) {
                    auVar51 = std::_Rb_tree_decrement(&p_Var46->super__Rb_tree_node_base);
                    p_Var19 = auVar51._0_8_;
                    __p = (char *)__x_02;
                    bVar9 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                      ((less<glcts::(anonymous_namespace)::ShaderKey> *)
                                       &p_Var19->_M_storage,(ShaderKey *)__x_02,auVar51._8_8_);
                    if (!bVar9) goto LAB_00bbbbc2;
                    p_Var42 = (_Link_type)
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)&(p_Var19->super__Rb_tree_node_base)._M_right)->
                              _M_allocated_capacity;
                    p_Var41 = p_Var42;
                    if (p_Var42 != (_Link_type)0x0) {
                      p_Var41 = p_Var46;
                    }
                    pVar52.second = extraout_RDX_01;
                    pVar52.first = &p_Var41->super__Rb_tree_node_base;
                    p_Var41 = p_Var46;
                    if (p_Var42 == (_Link_type)0x0) {
                      p_Var41 = p_Var19;
                    }
                  }
                }
                else {
                  __p = (char *)__x_02;
                  bVar9 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                    ((less<glcts::(anonymous_namespace)::ShaderKey> *)__x,
                                     (ShaderKey *)__x_02,__y_01);
                  if (bVar9) {
                    p_Var20 = extraout_RDX_03;
                    if ((_Link_type)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right ==
                        p_Var46) goto LAB_00bbbbb3;
                    auVar51 = std::_Rb_tree_increment(&p_Var46->super__Rb_tree_node_base);
                    p_Var41 = auVar51._0_8_;
                    __p = (char *)&p_Var41->_M_storage;
                    bVar9 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                      ((less<glcts::(anonymous_namespace)::ShaderKey> *)__x_02,
                                       (ShaderKey *)__p,auVar51._8_8_);
                    if (!bVar9) goto LAB_00bbbbc2;
                    p_Var19 = (_Link_type)
                              ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)&(p_Var46->super__Rb_tree_node_base)._M_right)->
                              _M_allocated_capacity;
                    p_Var42 = p_Var19;
                    if (p_Var19 != (_Link_type)0x0) {
                      p_Var42 = p_Var41;
                    }
                    pVar52.second = extraout_RDX_04;
                    pVar52.first = &p_Var42->super__Rb_tree_node_base;
                    if (p_Var19 == (_Link_type)0x0) {
                      p_Var41 = p_Var46;
                    }
                  }
                  else {
                    pVar52.second = extraout_RDX_03;
                    pVar52.first = &p_Var46->super__Rb_tree_node_base;
                    p_Var41 = (_Link_type)0x0;
                  }
                }
              }
              if (p_Var41 == (_Link_type)0x0) {
                std::
                _Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                ::_M_drop_node((_Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                                *)p_Var18,(_Link_type)__p);
                p_Var46 = (_Link_type)pVar52.first;
              }
              else {
                bVar9 = true;
                if (((_Link_type)pVar52.first == (_Link_type)0x0) &&
                   ((_Link_type)&shaders._M_t._M_impl.super__Rb_tree_header != p_Var41)) {
                  bVar9 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                    ((less<glcts::(anonymous_namespace)::ShaderKey> *)__x_02,
                                     (ShaderKey *)&p_Var41->_M_storage,(ShaderKey *)pVar52.second);
                }
                __p = (char *)p_Var18;
                std::_Rb_tree_insert_and_rebalance
                          (bVar9,(_Rb_tree_node_base *)p_Var18,&p_Var41->super__Rb_tree_node_base,
                           &shaders._M_t._M_impl.super__Rb_tree_header._M_header);
                shaders._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     shaders._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
                p_Var46 = p_Var18;
              }
            }
            else {
              __p = (char *)&p_Var46->_M_storage;
              bVar9 = std::less<glcts::(anonymous_namespace)::ShaderKey>::operator()
                                ((less<glcts::(anonymous_namespace)::ShaderKey> *)__x_01,
                                 (ShaderKey *)__p,__y);
              if (bVar9) goto LAB_00bbba6a;
            }
            *(GLuint *)((p_Var46->_M_storage)._M_storage + 0x48) = GVar11;
            if (name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
                (_func_int **)&name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10)
            {
              __p = (char *)(name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 1);
              operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                              _vptr_basic_ostream,(ulong)__p);
            }
          }
          uVar36 = uVar36 + 1;
          pSVar15 = programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar49].
                    super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        } while (uVar36 < (ulong)(((long)programConfigs.
                                         super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar49].
                                         super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar15
                                  >> 3) * -0x71c71c71c71c71c7));
      }
      uVar49 = uVar49 + 1;
      p_Var20 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    } while (uVar49 < (ulong)(((long)programConfigs.
                                     super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)programConfigs.
                                     super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  for (; p_Var31 = &shaders._M_t._M_impl.super__Rb_tree_header,
      (_Rb_tree_header *)p_Var20 != p_Var31;
      p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
    __p = (char *)(ulong)*(uint *)&p_Var20[3]._M_parent;
    glu::CallLogWrapper::glCompileShader(this_00,*(uint *)&p_Var20[3]._M_parent);
  }
  if ((_Rb_tree_header *)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left == p_Var31) {
    local_1688 = 0;
  }
  else {
    local_1688 = 0;
    p_Var21 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      glu::CallLogWrapper::glGetShaderiv
                (this_00,*(GLuint *)&p_Var21[3]._M_parent,0x8b81,(GLint *)&__dnew);
      glu::CallLogWrapper::glGetShaderSource
                (this_00,*(GLuint *)&p_Var21[3]._M_parent,4000,(GLsizei *)0x0,(GLchar *)&name);
      glu::CallLogWrapper::glGetShaderInfoLog
                (this_00,*(GLuint *)&p_Var21[3]._M_parent,1000,(GLsizei *)0x0,(GLchar *)&name_1);
      tcu::TestLog::writeKernelSource(glcts::(anonymous_namespace)::Logger::s_tcuLog,(char *)&name);
      __p = "shader";
      tcu::TestLog::writeCompileInfo
                (glcts::(anonymous_namespace)::Logger::s_tcuLog,"shader",
                 fixed_sample_locations_values + 1,(int)__dnew == 1,(char *)&name_1);
      if (!negativeLink) {
        if (negativeCompile) {
          if ((int)__dnew != 0) {
            __dnew_1 = (ulong)__dnew_1._1_7_ << 8;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1580);
            if ((char)__dnew_1 == '\0') {
              __p = 
              "Negative compilation case failed: shader shoult not compile, but GL_COMPILE_STATUS != 0"
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1580,
                         "Negative compilation case failed: shader shoult not compile, but GL_COMPILE_STATUS != 0"
                         ,0x57);
            }
LAB_00bbbe40:
            Logger::~Logger((Logger *)&__dnew_1);
            local_1688 = 0xffffffffffffffff;
          }
        }
        else if ((int)__dnew != 1) {
          __dnew_1 = (ulong)__dnew_1._1_7_ << 8;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1580);
          if ((char)__dnew_1 == '\0') {
            __p = "Shader compilation failed";
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1580,"Shader compilation failed",0x19);
          }
          goto LAB_00bbbe40;
        }
      }
      p_Var21 = (_Base_ptr)std::_Rb_tree_increment(p_Var21);
    } while ((_Rb_tree_header *)p_Var21 != &shaders._M_t._M_impl.super__Rb_tree_header);
  }
  if (negativeCompile) {
    p_Var20 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
        &shaders._M_t._M_impl.super__Rb_tree_header) {
      do {
        __p = (char *)(ulong)*(uint *)&p_Var20[3]._M_parent;
        glu::CallLogWrapper::glDeleteShader(this_00,*(uint *)&p_Var20[3]._M_parent);
        p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
      } while ((_Rb_tree_header *)p_Var20 != &shaders._M_t._M_impl.super__Rb_tree_header);
    }
  }
  else {
    if (programConfigs.
        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        programConfigs.
        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar49 = 0;
      p_Var20 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pCVar37 = programs.
                super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar36 = uVar49;
    }
    else {
      uVar27 = 0;
      do {
        pvVar30 = programConfigs.
                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ = 0;
        name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
        name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ = 0;
        GVar11 = glu::CallLogWrapper::glCreateProgram(this_00);
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream.
                      _4_4_,GVar11);
        pSVar15 = pvVar30[uVar27].
                  super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pvVar30[uVar27].
            super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
            ._M_impl.super__Vector_impl_data._M_finish != pSVar15) {
          pvVar30 = pvVar30 + uVar27;
          lVar38 = 0;
          uVar49 = 0;
          do {
            iVar16 = std::
                     map<glcts::(anonymous_namespace)::ShaderKey,_unsigned_int,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
                     ::find(&shaders,(key_type *)((long)&pSVar15->stage + lVar38));
            glu::CallLogWrapper::glAttachShader
                      (this_00,(GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream,*(GLuint *)&iVar16._M_node[3]._M_parent);
            __args = (uint *)((long)&((pvVar30->
                                      super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->stage + lVar38);
            if (name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ ==
                name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                         (iterator)name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_,
                         __args);
            }
            else {
              *(uint *)name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = *__args;
              name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ =
                   name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ + 4;
            }
            uVar49 = uVar49 + 1;
            pSVar15 = (pvVar30->
                      super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar38 = lVar38 + 0x48;
          } while (uVar49 < (ulong)(((long)(pvVar30->
                                           super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                           )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar15 >> 3) * -0x71c71c71c71c71c7));
        }
        pCVar7 = programs.
                 super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pCVar37 = programs.
                  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (programs.
            super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            programs.
            super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          if ((long)programs.
                    super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)programs.
                    super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0x7fffffffffffffe0) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          uVar36 = (long)programs.
                         super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)programs.
                         super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          uVar49 = uVar36;
          if (programs.
              super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              programs.
              super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            uVar49 = 1;
          }
          uVar50 = uVar49 + uVar36;
          if (0x3fffffffffffffe < uVar50) {
            uVar50 = 0x3ffffffffffffff;
          }
          if (CARRY8(uVar49,uVar36)) {
            uVar50 = 0x3ffffffffffffff;
          }
          if (uVar50 == 0) {
            pCVar22 = (pointer)0x0;
          }
          else {
            pCVar22 = (pointer)operator_new(uVar50 << 5);
          }
          pCVar22[uVar36].name =
               (GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&pCVar22[uVar36].stages,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
          pCVar39 = pCVar22;
          for (pCVar23 = pCVar37; pCVar7 != pCVar23; pCVar23 = pCVar23 + 1) {
            pCVar39->name = pCVar23->name;
            (pCVar39->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start =
                 (pCVar23->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            (pCVar39->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 (pCVar23->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            (pCVar39->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pCVar23->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
            (pCVar23->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            (pCVar23->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            (pCVar23->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pCVar39 = pCVar39 + 1;
          }
          if (pCVar37 != (pointer)0x0) {
            operator_delete(pCVar37,(long)programs.
                                          super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)pCVar37);
          }
          programs.
          super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pCVar22 + uVar50;
          programs.
          super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
          ._M_impl.super__Vector_impl_data._M_start = pCVar22;
        }
        else {
          (programs.
           super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
           ._M_impl.super__Vector_impl_data._M_finish)->name =
               (GLuint)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&(programs.
                       super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->stages,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
          pCVar39 = pCVar7;
        }
        programs.
        super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
        ._M_impl.super__Vector_impl_data._M_finish = pCVar39 + 1;
        __p = (char *)(ulong)programs.
                             super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar27].name;
        glu::CallLogWrapper::glLinkProgram
                  (this_00,programs.
                           super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar27].name);
        if (name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ != 0) {
          __p = (char *)(name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ -
                        name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_);
          operator_delete((void *)name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_,
                          (ulong)__p);
        }
        uVar27 = uVar27 + 1;
        uVar49 = ((long)programConfigs.
                        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)programConfigs.
                        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        p_Var20 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pCVar37 = programs.
                  super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar36 = uVar49;
      } while (uVar27 < uVar49);
    }
    for (; shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var20, uVar49 != 0;
        uVar49 = uVar49 - 1) {
      __p = (char *)(ulong)pCVar37->name;
      glu::CallLogWrapper::glLinkProgram(this_00,pCVar37->name);
      p_Var20 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      pCVar37 = pCVar37 + 1;
    }
    if ((_Rb_tree_header *)p_Var20 != &shaders._M_t._M_impl.super__Rb_tree_header) {
      do {
        __p = (char *)(ulong)*(uint *)&p_Var20[3]._M_parent;
        glu::CallLogWrapper::glDeleteShader(this_00,*(uint *)&p_Var20[3]._M_parent);
        p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
      } while ((_Rb_tree_header *)p_Var20 != &shaders._M_t._M_impl.super__Rb_tree_header);
    }
    if (uVar36 != 0) {
      pCVar37 = programs.
                super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        glu::CallLogWrapper::glGetProgramiv(this_00,pCVar37->name,0x8b82,(GLint *)&__dnew_1);
        glu::CallLogWrapper::glGetProgramInfoLog
                  (this_00,pCVar37->name,1000,(GLsizei *)0x0,(GLchar *)&name);
        __p = "program";
        tcu::TestLog::writeCompileInfo
                  (glcts::(anonymous_namespace)::Logger::s_tcuLog,"program",
                   fixed_sample_locations_values + 1,(int)__dnew_1 == 1,(char *)&name);
        if (negativeLink) {
          if ((int)__dnew_1 != 0) {
            name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)
                 ((ulong)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                         _vptr_basic_ostream._1_7_ << 8);
            std::__cxx11::ostringstream::ostringstream
                      ((ostringstream *)
                       &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
            if ((char)name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                == '\0') {
              __p = "Negative link case failed: program should not link, but GL_LINK_STATUS != 0";
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                         "Negative link case failed: program should not link, but GL_LINK_STATUS != 0"
                         ,0x4b);
            }
LAB_00bbc2d1:
            Logger::~Logger((Logger *)&name_1);
            local_1688 = 0xffffffffffffffff;
          }
        }
        else if ((int)__dnew_1 != 1) {
          name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)
               ((ulong)name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                       ._1_7_ << 8);
          std::__cxx11::ostringstream::ostringstream
                    ((ostringstream *)
                     &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
          __p = "Shader link failed";
          glcts::(anonymous_namespace)::Logger::operator<<
                    ((Logger *)&name_1,(char (*) [19])"Shader link failed");
          goto LAB_00bbc2d1;
        }
        pCVar37 = pCVar37 + 1;
        uVar36 = uVar36 - 1;
      } while (uVar36 != 0);
    }
  }
  std::
  _Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
  ::_M_erase((_Rb_tree<glcts::(anonymous_namespace)::ShaderKey,_std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>,_std::_Select1st<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>,_std::less<glcts::(anonymous_namespace)::ShaderKey>,_std::allocator<std::pair<const_glcts::(anonymous_namespace)::ShaderKey,_unsigned_int>_>_>
              *)shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,(_Link_type)__p);
  std::
  vector<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
  ::~vector(&programConfigs);
  uVar49 = (long)programs.
                 super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)programs.
                 super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (((!negativeCompile && !negativeLink) && (local_1688 == 0)) &&
     (programs.
      super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      programs.
      super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    uVar36 = 0;
    do {
      pCVar37 = programs.
                super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                ._M_impl.super__Vector_impl_data._M_start;
      glu::CallLogWrapper::glUseProgram
                (this_00,programs.
                         super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar36].name);
      pCVar40 = pCVar37 + uVar36;
      pUVar34 = (uniforms->
                super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((uniforms->
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          )._M_impl.super__Vector_impl_data._M_finish != pUVar34) {
        lVar38 = 0;
        uVar49 = 0;
        do {
          setUniform(this,(Uniform *)((long)&(pUVar34->type).enumType + lVar38),pCVar40);
          uVar49 = uVar49 + 1;
          pUVar34 = (uniforms->
                    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar38 = lVar38 + 0x1d8;
        } while (uVar49 < (ulong)(((long)(uniforms->
                                         super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar34
                                  >> 3) * -0x34115b1e5f75270d));
      }
      puVar25 = (pCVar40->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pCVar40->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish != puVar25) {
        __x_00 = &pCVar40->stages;
        local_1688 = 0;
        do {
          if ((subroutineUniforms->
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              )._M_impl.super__Vector_impl_data._M_finish ==
              (subroutineUniforms->
              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
              )._M_impl.super__Vector_impl_data._M_start) break;
          glu::CallLogWrapper::glGetProgramStageiv
                    (this_00,pCVar40->name,puVar25[local_1688],0x8e47,(GLint *)&__dnew);
          if ((long)(int)__dnew != 0) {
            name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)
                 ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                 & 0xffffffff00000000);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&programConfigs,
                       (long)(int)__dnew,(value_type_conflict4 *)&name,(allocator_type *)&name_1);
            pSVar29 = (subroutineUniforms->
                      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            if ((subroutineUniforms->
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                )._M_impl.super__Vector_impl_data._M_finish != pSVar29) {
              uVar49 = 0;
              do {
                GVar2 = (__x_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[local_1688];
                bVar9 = DefOccurence::occurs(&pSVar29[uVar49].defOccurence,GVar2);
                if (((bVar9) && ((pSVar29[uVar49].used & 1U) != 0)) &&
                   (pSVar43 = pSVar29 + uVar49, 0 < pSVar43->arraySize)) {
                  iVar35 = 0;
                  do {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__dnew_1,
                               __x_00);
                    bVar9 = LayoutSpecifierBase::isImplicit
                                      (&(pSVar43->location).super_LayoutSpecifierBase,
                                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       &__dnew_1);
                    if (__dnew_1 != 0) {
                      operator_delete((void *)__dnew_1,local_1580._8_8_ - __dnew_1);
                    }
                    if (bVar9) {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&name,(pSVar43->name)._M_dataplus._M_p,
                                 (pSVar43->name)._M_string_length);
                      SubroutineUniform::streamArrayStr(pSVar43,&name,iVar35);
                      GVar11 = pCVar40->name;
                      std::__cxx11::stringbuf::str();
                      uVar12 = glu::CallLogWrapper::glGetSubroutineUniformLocation
                                         (this_00,GVar11,GVar2,
                                          (GLchar *)
                                          name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                          _vptr_basic_ostream);
                      if (name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream !=
                          (_func_int **)
                          &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
                        operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream,
                                        name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _16_8_ + 1);
                      }
                      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
                      std::ios_base::~ios_base
                                ((ios_base *)
                                 &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                                );
                    }
                    else {
                      uVar12 = (pSVar43->location).super_LayoutSpecifierBase.val + iVar35;
                    }
                    if ((int)uVar12 < 0) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                                    ,0x617,
                                    "void glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::setSubroutineUniform(const SubroutineUniform &, const CompiledProgram &, GLenum, std::vector<glw::GLuint> &)"
                                   );
                    }
                    this_02 = SubroutineUniform::getSelectedFunction(pSVar43,iVar35);
                    shaders._M_t._M_impl._0_8_ = 0;
                    shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                    shaders._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                    shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                    pGVar24 = (GLenum *)operator_new(4);
                    shaders._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = pGVar24 + 1;
                    *pGVar24 = GVar2;
                    shaders._M_t._M_impl._0_8_ = pGVar24;
                    shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                         (_Base_ptr)shaders._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                    bVar9 = LayoutSpecifierBase::isImplicit
                                      ((LayoutSpecifierBase *)this_02,
                                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       &shaders);
                    operator_delete(pGVar24,4);
                    if (bVar9) {
                      GVar11 = glu::CallLogWrapper::glGetSubroutineIndex
                                         (this_00,pCVar40->name,GVar2,
                                          (this_02->name)._M_dataplus._M_p);
                    }
                    else {
                      GVar11 = (this_02->index).super_LayoutSpecifierBase.val;
                    }
                    if ((int)((ulong)((long)programConfigs.
                                            super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)programConfigs.
                                           super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 2) <=
                        (int)uVar12) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                                    ,0x612,
                                    "void glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::setSubroutineUniform(const SubroutineUniform &, const CompiledProgram &, GLenum, std::vector<glw::GLuint> &)"
                                   );
                    }
                    *(GLuint *)
                     ((long)&((programConfigs.
                               super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                             )._M_impl.super__Vector_impl_data._M_start + (ulong)uVar12 * 4) =
                         GVar11;
                    iVar35 = iVar35 + 1;
                  } while (iVar35 < pSVar43->arraySize);
                }
                uVar49 = uVar49 + 1;
                pSVar29 = (subroutineUniforms->
                          super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                          )._M_impl.super__Vector_impl_data._M_start;
              } while (uVar49 < (ulong)(((long)(subroutineUniforms->
                                               super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pSVar29 >> 3) * 0x4fa4fa4fa4fa4fa5));
            }
            glu::CallLogWrapper::glUniformSubroutinesuiv
                      (this_00,(__x_00->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start[local_1688],(int)__dnew,
                       (GLuint *)
                       programConfigs.
                       super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
            if (programConfigs.
                super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(programConfigs.
                              super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)programConfigs.
                                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)programConfigs.
                                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          local_1688 = local_1688 + 1;
          puVar25 = (pCVar40->stages).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (local_1688 <
                 (ulong)((long)(pCVar40->stages).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar25 >> 2));
      }
      if (*puVar25 == 0x91b9) {
        glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)&name_1);
        glu::CallLogWrapper::glBindBuffer
                  (this_00,0x90d2,
                   (GLuint)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream);
        glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,(void *)0x0,0x88e9);
        glu::CallLogWrapper::glBindBufferBase
                  (this_00,0x90d2,1,
                   (GLuint)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream);
        glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
        glu::CallLogWrapper::glMemoryBarrier(this_00,0x2000);
        pfVar26 = (float *)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x10,1);
        if (((((*pfVar26 != 0.0) || (NAN(*pfVar26))) || (pfVar26[1] != 1.0)) ||
            ((NAN(pfVar26[1]) || (pfVar26[2] != 0.0)))) || (NAN(pfVar26[2]))) {
          name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
               (_func_int **)
               ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream &
               0xffffffffffffff00);
          std::__cxx11::ostringstream::ostringstream
                    ((ostringstream *)
                     &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
          if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream ==
              '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8
                       ,"Program ",8);
          }
          if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream ==
              '\0') {
            std::ostream::_M_insert<unsigned_long>
                      ((ulong)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
          }
          if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream ==
              '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8
                       ,": Wrong color. Expected green, got (",0x24);
          }
          if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream ==
              '\0') {
            std::ostream::operator<<
                      (&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                       (int)*pfVar26);
          }
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x1acdea0);
          if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream ==
              '\0') {
            std::ostream::operator<<
                      (&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                       (int)pfVar26[1]);
          }
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x1acdea0);
          if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream ==
              '\0') {
            std::ostream::operator<<
                      (&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                       (int)pfVar26[2]);
          }
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x1acdea0);
          if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream ==
              '\0') {
            std::ostream::operator<<
                      (&name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8,
                       (int)pfVar26[3]);
          }
          glcts::(anonymous_namespace)::Logger::operator<<((Logger *)&name,(char (*) [3])0x1cab92b);
          Logger::~Logger((Logger *)&name);
          local_15e0 = 0xffffffffffffffff;
        }
        else {
          local_15e0 = 0;
        }
        glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
        glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)&name_1);
      }
      else {
        glu::CallLogWrapper::glClear(this_00,0x4000);
        glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
        iVar35 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                   _vptr_RenderContext[4])();
        iVar35 = *(int *)CONCAT44(extraout_var,iVar35);
        iVar45 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                   _vptr_RenderContext[4])();
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&name_1,
                   (long)(iVar35 * *(int *)(CONCAT44(extraout_var_00,iVar45) + 4) * 4),
                   (allocator_type *)&name);
        iVar35 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                   _vptr_RenderContext[4])();
        width = *(GLsizei *)CONCAT44(extraout_var_01,iVar35);
        iVar35 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                   _vptr_RenderContext[4])();
        glu::CallLogWrapper::glReadPixels
                  (this_00,0,0,width,*(GLsizei *)(CONCAT44(extraout_var_02,iVar35) + 4),0x1908,
                   0x1401,name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream);
        puVar28 = &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
        if ((_func_int **)name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ !=
            name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream) {
          uVar49 = 0;
          do {
            if (((*(char *)((long)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream + uVar49) != '\0') ||
                (*(char *)((long)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                 _vptr_basic_ostream + uVar49 + 1) != -1)) ||
               (*(char *)((long)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream + uVar49 + 2) != '\0')) {
              name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                   (_func_int **)
                   ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                           _vptr_basic_ostream & 0xffffffffffffff00);
              std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar28);
              if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == '\0') {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar28,"Program ",8);
              }
              if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == '\0') {
                std::ostream::_M_insert<unsigned_long>((ulong)puVar28);
              }
              if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == '\0') {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)puVar28,": Wrong color. Expected green, got (",0x24);
              }
              if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == '\0') {
                std::ostream::operator<<
                          (puVar28,(uint)*(byte *)((long)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar49));
              }
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [3])0x1acdea0);
              if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == '\0') {
                std::ostream::operator<<
                          (puVar28,(uint)*(byte *)((long)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar49 + 1));
              }
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [3])0x1acdea0);
              if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == '\0') {
                std::ostream::operator<<
                          (puVar28,(uint)*(byte *)((long)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar49 + 2));
              }
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [3])0x1acdea0);
              if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                  == '\0') {
                std::ostream::operator<<
                          (puVar28,(uint)*(byte *)((long)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream + uVar49 + 3));
              }
              glcts::(anonymous_namespace)::Logger::operator<<
                        ((Logger *)&name,(char (*) [3])0x1cab92b);
              Logger::~Logger((Logger *)&name);
              uVar49 = 0xffffffffffffffff;
              goto LAB_00bbcbef;
            }
            uVar49 = uVar49 + 4;
          } while (uVar49 < (ulong)(name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_
                                   - (long)name_1.super_basic_ostream<char,_std::char_traits<char>_>
                                           ._vptr_basic_ostream));
        }
        uVar49 = 0;
LAB_00bbcbef:
        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
             (_func_int **)
             ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream &
             0xffffffffffffff00);
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8);
        this_01 = glcts::(anonymous_namespace)::Logger::s_tcuLog;
        local_15e0 = uVar49;
        iVar35 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                   _vptr_RenderContext[4])();
        iVar35 = *(int *)CONCAT44(extraout_var_03,iVar35);
        iVar45 = (*((this->super_SubcaseBase).super_GLWrapper.m_context)->m_renderCtx->
                   _vptr_RenderContext[4])();
        tcu::TestLog::writeImage
                  (this_01,"rendered image",fixed_sample_locations_values + 1,
                   QP_IMAGE_COMPRESSION_MODE_BEST,QP_IMAGE_FORMAT_RGBA8888,iVar35,
                   *(int *)(CONCAT44(extraout_var_04,iVar45) + 4),0,
                   name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream);
        Logger::~Logger((Logger *)&name);
        if (name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream !=
            (_func_int **)0x0) {
          operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream,
                          name_1.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ -
                          (long)name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream);
        }
      }
      pCVar40 = programs.
                super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                ._M_impl.super__Vector_impl_data._M_start + uVar36;
      name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
           name.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ & 0xffffffff00000000;
      name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_ = 0;
      name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_ =
           &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      name.super_basic_ostream<char,_std::char_traits<char>_>._40_8_ = 0;
      name.super_basic_ostream<char,_std::char_traits<char>_>._32_8_ =
           name.super_basic_ostream<char,_std::char_traits<char>_>._24_8_;
      glu::CallLogWrapper::glGetIntegerv(this_00,0x826e,(GLint *)&name_1);
      pUVar34 = (uniforms->
                super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((uniforms->
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          )._M_impl.super__Vector_impl_data._M_finish == pUVar34) {
        local_1688 = 0;
      }
      else {
        lVar38 = 0;
        uVar49 = 0;
        local_1688 = 0;
        do {
          uVar27 = runQueryUniform(this,pCVar40,
                                   (Uniform *)((long)&(pUVar34->type).enumType + lVar38),
                                   (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                    *)&name,(GLuint)name_1.
                                                  super_basic_ostream<char,_std::char_traits<char>_>
                                                  ._vptr_basic_ostream);
          local_1688 = local_1688 | uVar27;
          uVar49 = uVar49 + 1;
          pUVar34 = (uniforms->
                    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar38 = lVar38 + 0x1d8;
        } while (uVar49 < (ulong)(((long)(uniforms->
                                         super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar34
                                  >> 3) * -0x34115b1e5f75270d));
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&name);
      if ((subroutineUniforms->
          super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          )._M_impl.super__Vector_impl_data._M_finish !=
          (subroutineUniforms->
          super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        glu::CallLogWrapper::glGetIntegerv(this_00,0x8de8,&maxLocation);
        glu::CallLogWrapper::glGetIntegerv(this_00,0x8de7,&maxIndex);
        if ((pCVar40->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (pCVar40->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          local_1610 = 0;
          do {
            local_1580._16_8_ = local_1580;
            local_1580._0_8_ = local_1580._0_8_ & 0xffffffff00000000;
            local_1580._8_8_ = (undefined1 *)0x0;
            local_1560 = 0;
            shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                 &shaders._M_t._M_impl.super__Rb_tree_header._M_header;
            shaders._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 shaders._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
            shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
            pSVar29 = (subroutineUniforms->
                      super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                 shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            local_1568 = (_Base_ptr)local_1580._16_8_;
            if ((subroutineUniforms->
                super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                )._M_impl.super__Vector_impl_data._M_finish != pSVar29) {
              uVar49 = 0;
              do {
                local_15d4 = maxLocation;
                iVar35 = 0;
                if (0 < maxLocation) {
                  iVar35 = maxLocation;
                }
                if (pSVar29[uVar49].arraySize < 1) {
                  local_16d0 = 0;
                }
                else {
                  GVar2 = (pCVar40->stages).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_1610];
                  pSVar43 = pSVar29 + uVar49;
                  local_16d0 = 0;
                  iVar45 = 0;
                  do {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name_1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&name_1,(pSVar43->name)._M_dataplus._M_p,
                               (pSVar43->name)._M_string_length);
                    SubroutineUniform::streamArrayStr(pSVar43,&name_1,iVar45);
                    GVar11 = pCVar40->name;
                    std::__cxx11::stringbuf::str();
                    uVar12 = glu::CallLogWrapper::glGetSubroutineUniformLocation
                                       (this_00,GVar11,GVar2,
                                        (GLchar *)
                                        name.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream);
                    if (name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                        != (_func_int **)
                           &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
                      operator_delete(name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream,
                                      name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                                      + 1);
                    }
                    if (GVar2 == 0x8b30) {
                      GVar48 = 0x92f2;
                    }
                    else {
                      GVar48 = 0x92ee;
                      if (GVar2 != 0x8b31) {
                        if (GVar2 != 0x91b9) {
                          __assert_fail("0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                                        ,0x70f,
                                        "long glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::runQueryUniformSubroutine(const CompiledProgram &, GLenum, const SubroutineUniform &, std::set<GLuint> &, GLint)"
                                       );
                        }
                        GVar48 = 0x92f3;
                      }
                    }
                    GVar11 = pCVar40->name;
                    std::__cxx11::stringbuf::str();
                    uVar13 = glu::CallLogWrapper::glGetProgramResourceLocation
                                       (this_00,GVar11,GVar48,
                                        (GLchar *)
                                        name.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream);
                    if (name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                        != (_func_int **)
                           &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
                      operator_delete(name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream,
                                      name.super_basic_ostream<char,_std::char_traits<char>_>._16_8_
                                      + 1);
                    }
                    if (uVar12 != uVar13) {
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                           (_func_int **)
                           ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream & 0xffffffffffffff00);
                      puVar28 = &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar28);
                      glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)&name,(char (*) [33])"Locations of subrutine uniform \"")
                      ;
                      std::__cxx11::stringbuf::str();
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)puVar28,
                                   (char *)programConfigs.
                                           super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                   (long)programConfigs.
                                         super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)puVar28,
                                   "\" returned by glGetUniformLocation and differ glGetProgramResourceLocation differ: "
                                   ,0x53);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::ostream::operator<<(puVar28,uVar12);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)puVar28," != ",4);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::ostream::operator<<(puVar28,uVar13);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar28,".",1)
                        ;
                      }
                      if (programConfigs.
                          super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&programConfigs.
                                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(programConfigs.
                                        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (ulong)((long)&((programConfigs.
                                                                                                                  
                                                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->
                                                  super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
                      }
                      Logger::~Logger((Logger *)&name);
                      local_16d0 = 0xffffffffffffffff;
                    }
                    bVar10 = DefOccurence::occurs(&pSVar43->defOccurence,GVar2);
                    bVar9 = pSVar43->used;
                    __dnew = 0;
                    puStack_15f0 = (pointer)0x0;
                    local_15e8 = (pointer)0x0;
                    pGVar24 = (GLenum *)operator_new(4);
                    bVar47 = bVar10 & bVar9;
                    puStack_15f0 = pGVar24 + 1;
                    *pGVar24 = GVar2;
                    __dnew = (size_type)pGVar24;
                    local_15e8 = puStack_15f0;
                    bVar9 = LayoutSpecifierBase::isImplicit
                                      (&(pSVar43->location).super_LayoutSpecifierBase,
                                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       &__dnew);
                    operator_delete(pGVar24,4);
                    if (bVar9) {
                      uVar13 = 0xffffffff;
                      if ((bVar47 != 0) && (uVar13 = uVar12, (int)uVar12 < 0)) {
                        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             = (_func_int **)
                               ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream._1_7_ << 8);
                        puVar28 = &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8
                        ;
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar28);
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)puVar28,"Unexpected subroutine uniform \"",0x1f);
                        }
                        std::__cxx11::stringbuf::str();
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)puVar28,
                                     (char *)programConfigs.
                                             super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                     (long)programConfigs.
                                           super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)puVar28,"\" location: expected positive value, got "
                                     ,0x29);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::ostream::operator<<(puVar28,uVar12);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)puVar28,".",1);
                        }
                        if (programConfigs.
                            super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            (pointer)&programConfigs.
                                      super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          operator_delete(programConfigs.
                                          super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (ulong)((long)&((programConfigs.
                                                                                                                      
                                                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->
                                                  super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
                        }
                        Logger::~Logger((Logger *)&name);
                        local_16d0 = 0xffffffffffffffff;
                        uVar13 = 0xffffffff;
                      }
                    }
                    else {
                      uVar13 = (pSVar43->location).super_LayoutSpecifierBase.val + iVar45;
                      if ((uVar13 != uVar12) && (uVar12 != 0xffffffff || bVar47 != 0)) {
                        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             = (_func_int **)
                               ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream._1_7_ << 8);
                        std::__cxx11::ostringstream::ostringstream
                                  ((ostringstream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8);
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,"Unexpected subroutine uniform \"",0x1f);
                        }
                        std::__cxx11::stringbuf::str();
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,
                                     (char *)programConfigs.
                                             super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                     (long)programConfigs.
                                           super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
                        }
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [22])"\" location: expected ");
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::ostream::operator<<
                                    (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,uVar13);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,", got ",6);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::ostream::operator<<
                                    (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,uVar12);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,".",1);
                        }
                        if (programConfigs.
                            super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            (pointer)&programConfigs.
                                      super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          operator_delete(programConfigs.
                                          super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (ulong)((long)&((programConfigs.
                                                                                                                      
                                                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->
                                                  super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
                        }
                        Logger::~Logger((Logger *)&name);
                        local_16d0 = 0xffffffffffffffff;
                      }
                    }
                    puVar28 = local_1580;
                    puVar32 = (undefined1 *)local_1580._8_8_;
                    if (-1 < (int)uVar13) {
                      for (; puVar32 != (undefined1 *)0x0;
                          puVar32 = *(undefined1 **)
                                     (puVar32 +
                                     ((ulong)(*(uint *)(puVar32 + 0x20) < uVar13) + 2) * 8)) {
                        if (*(uint *)(puVar32 + 0x20) >= uVar13) {
                          puVar28 = puVar32;
                        }
                      }
                      puVar32 = local_1580;
                      if ((puVar28 != local_1580) &&
                         (puVar32 = puVar28, uVar13 < *(uint *)(puVar28 + 0x20))) {
                        puVar32 = local_1580;
                      }
                      if (puVar32 != local_1580) {
                        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             = (_func_int **)
                               ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream & 0xffffffffffffff00);
                        std::__cxx11::ostringstream::ostringstream
                                  ((ostringstream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8);
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [21])"Subroutine uniform \"");
                        std::__cxx11::stringbuf::str();
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,
                                     (char *)programConfigs.
                                             super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start,
                                     (long)programConfigs.
                                           super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,"\" location (",0xc);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::ostream::operator<<
                                    (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,uVar13);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,") is not unique.",0x10);
                        }
                        if (programConfigs.
                            super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            (pointer)&programConfigs.
                                      super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          operator_delete(programConfigs.
                                          super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (ulong)((long)&((programConfigs.
                                                                                                                      
                                                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->
                                                  super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
                        }
                        Logger::~Logger((Logger *)&name);
                        local_16d0 = 0xffffffffffffffff;
                      }
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                           (_func_int **)
                           CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream._4_4_,uVar13);
                      std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::_M_insert_unique<unsigned_int>
                                ((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)&__dnew_1,(uint *)&name);
                    }
                    if (iVar35 <= (int)uVar12) {
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                           (_func_int **)
                           ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream & 0xffffffffffffff00);
                      std::__cxx11::ostringstream::ostringstream
                                ((ostringstream *)
                                 &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8)
                      ;
                      glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)&name,(char (*) [21])"Subroutine uniform \"");
                      std::__cxx11::stringbuf::str();
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,
                                   (char *)programConfigs.
                                           super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start,
                                   (long)programConfigs.
                                         super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
                      }
                      glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)&name,(char (*) [22])"\" returned location (");
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::ostream::operator<<
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,uVar12);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,") is greater than implementation dependent limit (",
                                   0x32);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::ostream::operator<<
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,local_15d4);
                      }
                      glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)&name,(char (*) [3])0x1cab92b);
                      if (programConfigs.
                          super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (pointer)&programConfigs.
                                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        operator_delete(programConfigs.
                                        super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (ulong)((long)&((programConfigs.
                                                                                                                  
                                                  super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  )->
                                                  super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + 1));
                      }
                      Logger::~Logger((Logger *)&name);
                      local_16d0 = 0xffffffffffffffff;
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name_1);
                    std::ios_base::~ios_base
                              ((ios_base *)
                               &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70
                              );
                    iVar45 = iVar45 + 1;
                  } while (iVar45 < pSVar43->arraySize);
                }
                local_1688 = local_16d0 | local_1688;
                pSVar29 = (subroutineUniforms->
                          super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                pSVar44 = *(pointer *)
                           &pSVar29[uVar49].functions.fn.
                            super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                ;
                if (pSVar29[uVar49].functions.fn.
                    super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                    ._M_impl.super__Vector_impl_data._M_finish != pSVar44) {
                  uVar27 = 0;
                  do {
                    GVar8 = maxIndex;
                    GVar2 = (pCVar40->stages).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[local_1610];
                    bVar9 = DefOccurence::occurs(&pSVar29[uVar49].defOccurence,GVar2);
                    if (bVar9) {
                      bVar47 = (subroutineUniforms->
                               super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar49].used;
                    }
                    else {
                      bVar47 = 0;
                    }
                    pSVar44 = pSVar44 + uVar27;
                    name_1.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                         (_func_int **)
                         &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10;
                    _Var4._M_p = (pSVar44->name)._M_dataplus._M_p;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&name_1,_Var4._M_p,
                               _Var4._M_p + (pSVar44->name)._M_string_length);
                    GVar11 = glu::CallLogWrapper::glGetSubroutineIndex
                                       (this_00,pCVar40->name,GVar2,
                                        (GLchar *)
                                        name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream);
                    if (GVar2 == 0x8b30) {
                      GVar48 = 0x92ec;
                    }
                    else {
                      GVar48 = 0x92e8;
                      if (GVar2 != 0x8b31) {
                        if (GVar2 != 0x91b9) {
                          __assert_fail("0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                                        ,0x77c,
                                        "long glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::runQueryUniformSubroutineFunction(const CompiledProgram &, GLenum, const SubroutineFunction &, std::set<GLuint> &, GLint, bool)"
                                       );
                        }
                        GVar48 = 0x92ed;
                      }
                    }
                    GVar14 = glu::CallLogWrapper::glGetProgramResourceIndex
                                       (this_00,pCVar40->name,GVar48,
                                        (GLchar *)
                                        name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                        _vptr_basic_ostream);
                    if (GVar11 == GVar14) {
                      local_1690 = 0;
                    }
                    else {
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                           (_func_int **)
                           ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream & 0xffffffffffffff00);
                      std::__cxx11::ostringstream::ostringstream
                                ((ostringstream *)
                                 &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8)
                      ;
                      glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)&name,(char (*) [33])"Indices of subroutine function \"")
                      ;
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,
                                   (char *)name_1.super_basic_ostream<char,_std::char_traits<char>_>
                                           ._vptr_basic_ostream,
                                   name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,
                                   "\" returned by glGetSubroutineIndex and differ glGetProgramResourceIndex differ: "
                                   ,0x50);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::ostream::operator<<
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,GVar11);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8," != ",4);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::ostream::operator<<
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,GVar14);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,".",1);
                      }
                      Logger::~Logger((Logger *)&name);
                      local_1690 = 0xffffffffffffffff;
                    }
                    programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    pvVar30 = (pointer)operator_new(4);
                    programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish =
                         (pointer)((long)&(pvVar30->
                                          super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                                          )._M_impl.super__Vector_impl_data._M_start + 4);
                    *(GLenum *)
                     &(pvVar30->
                      super__Vector_base<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>
                      )._M_impl.super__Vector_impl_data._M_start = GVar2;
                    programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start = pvVar30;
                    programConfigs.
                    super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         programConfigs.
                         super__Vector_base<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>,_std::allocator<std::vector<glcts::(anonymous_namespace)::ShaderKey,_std::allocator<glcts::(anonymous_namespace)::ShaderKey>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                    bVar9 = LayoutSpecifierBase::isImplicit
                                      ((LayoutSpecifierBase *)pSVar44,
                                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       &programConfigs);
                    operator_delete(pvVar30,4);
                    if (bVar9) {
                      GVar14 = 0xffffffff;
                      if ((bVar47 != 0) && (GVar14 = GVar11, (int)GVar11 < 0)) {
                        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             = (_func_int **)
                               ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream._1_7_ << 8);
                        std::__cxx11::ostringstream::ostringstream
                                  ((ostringstream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8);
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,
                                   (char (*) [33])"Unexpected subroutine function \"");
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,
                                     (char *)name_1.
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream,
                                     name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_
                                    );
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,"\" index: expected positive value, got ",0x26);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::ostream::operator<<
                                    (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,GVar11);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,".",1);
                        }
                        Logger::~Logger((Logger *)&name);
                        local_1690 = 0xffffffffffffffff;
                        GVar14 = 0xffffffff;
                      }
                    }
                    else {
                      GVar14 = (pSVar44->index).super_LayoutSpecifierBase.val;
                      if (((~bVar47 & GVar11 == 0xffffffff) == 0) && (GVar14 != GVar11)) {
                        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             = (_func_int **)
                               ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream._1_7_ << 8);
                        std::__cxx11::ostringstream::ostringstream
                                  ((ostringstream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8);
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,
                                   (char (*) [33])"Unexpected subroutine function \"");
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,
                                     (char *)name_1.
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream,
                                     name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_
                                    );
                        }
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [19])"\" index: expected ");
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::ostream::operator<<
                                    (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,GVar14);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,", got ",6);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::ostream::operator<<
                                    (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,GVar11);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,".",1);
                        }
                        Logger::~Logger((Logger *)&name);
                        local_1690 = 0xffffffffffffffff;
                      }
                    }
                    p_Var31 = &shaders._M_t._M_impl.super__Rb_tree_header;
                    p_Var21 = &p_Var31->_M_header;
                    p_Var5 = shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
                    if (-1 < (int)GVar14) {
                      for (; (_Rb_tree_header *)p_Var5 != (_Rb_tree_header *)0x0;
                          p_Var5 = (&p_Var5->_M_left)[bVar9]) {
                        bVar9 = (uint)*(size_t *)(p_Var5 + 1) < GVar14;
                        if (!bVar9) {
                          p_Var21 = p_Var5;
                        }
                      }
                      p_Var33 = p_Var31;
                      if (((_Rb_tree_header *)p_Var21 != p_Var31) &&
                         (p_Var33 = (_Rb_tree_header *)p_Var21,
                         GVar14 < (uint)((_Rb_tree_header *)p_Var21)->_M_node_count)) {
                        p_Var33 = p_Var31;
                      }
                      if (p_Var33 != p_Var31) {
                        name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream
                             = (_func_int **)
                               ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                       _vptr_basic_ostream & 0xffffffffffffff00);
                        std::__cxx11::ostringstream::ostringstream
                                  ((ostringstream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8);
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [22])"Subroutine function \"");
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,
                                     (char *)name_1.
                                             super_basic_ostream<char,_std::char_traits<char>_>.
                                             _vptr_basic_ostream,
                                     name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_
                                    );
                        }
                        glcts::(anonymous_namespace)::Logger::operator<<
                                  ((Logger *)&name,(char (*) [10])"\" index (");
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::ostream::operator<<
                                    (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,GVar14);
                        }
                        if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                  _vptr_basic_ostream == '\0') {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)
                                     &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                      field_0x8,") is not unique.",0x10);
                        }
                        Logger::~Logger((Logger *)&name);
                        local_1690 = 0xffffffffffffffff;
                      }
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                           (_func_int **)
                           CONCAT44(name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    _vptr_basic_ostream._4_4_,GVar14);
                      std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::_M_insert_unique<unsigned_int>
                                ((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)&shaders,(uint *)&name);
                    }
                    if (GVar8 <= (int)GVar11 && -1 < (int)GVar11) {
                      name.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                           (_func_int **)
                           ((ulong)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                   _vptr_basic_ostream & 0xffffffffffffff00);
                      std::__cxx11::ostringstream::ostringstream
                                ((ostringstream *)
                                 &name.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8)
                      ;
                      glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)&name,(char (*) [22])"Subroutine function \"");
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,
                                   (char *)name_1.super_basic_ostream<char,_std::char_traits<char>_>
                                           ._vptr_basic_ostream,
                                   name_1.super_basic_ostream<char,_std::char_traits<char>_>._8_8_);
                      }
                      glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)&name,(char (*) [19])"\" returned index (");
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::ostream::operator<<
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,GVar11);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)
                                   &name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,") is greater than implementation dependent limit (",
                                   0x32);
                      }
                      if ((char)name.super_basic_ostream<char,_std::char_traits<char>_>.
                                _vptr_basic_ostream == '\0') {
                        std::ostream::operator<<
                                  (&name.super_basic_ostream<char,_std::char_traits<char>_>.
                                    field_0x8,GVar8);
                      }
                      glcts::(anonymous_namespace)::Logger::operator<<
                                ((Logger *)&name,(char (*) [3])0x1cab92b);
                      Logger::~Logger((Logger *)&name);
                      local_1690 = 0xffffffffffffffff;
                    }
                    if (name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                        _vptr_basic_ostream !=
                        (_func_int **)
                        &name_1.super_basic_ostream<char,_std::char_traits<char>_>.field_0x10) {
                      operator_delete(name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                      _vptr_basic_ostream,
                                      name_1.super_basic_ostream<char,_std::char_traits<char>_>.
                                      _16_8_ + 1);
                    }
                    local_1688 = local_1688 | local_1690;
                    uVar27 = uVar27 + 1;
                    pSVar29 = (subroutineUniforms->
                              super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    pSVar44 = *(pointer *)
                               &pSVar29[uVar49].functions.fn.
                                super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                    ;
                  } while (uVar27 < (ulong)(((long)pSVar29[uVar49].functions.fn.
                                                                                                      
                                                  super__Vector_base<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)pSVar44 >> 3) * 0xf83e0f83e0f83e1));
                }
                uVar49 = uVar49 + 1;
                pSVar29 = (subroutineUniforms->
                          super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                          )._M_impl.super__Vector_impl_data._M_start;
              } while (uVar49 < (ulong)(((long)(subroutineUniforms->
                                               super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                                               )._M_impl.super__Vector_impl_data._M_finish -
                                         (long)pSVar29 >> 3) * 0x4fa4fa4fa4fa4fa5));
            }
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&shaders);
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&__dnew_1);
            local_1610 = local_1610 + 1;
          } while (local_1610 <
                   (ulong)((long)(pCVar40->stages).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(pCVar40->stages).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2));
        }
      }
      uVar36 = uVar36 + 1;
      uVar49 = (long)programs.
                     super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)programs.
                     super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      local_1688 = local_1688 | local_15e0;
    } while ((local_1688 == 0 && uVar36 < uVar49) && (!negativeCompile && !negativeLink));
  }
  pCVar7 = programs.
           super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar37 = programs.
            super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
            ._M_impl.super__Vector_impl_data._M_start;
  glu::CallLogWrapper::glUseProgram(this_00,0);
  if (pCVar7 != pCVar37) {
    lVar38 = uVar49 + (uVar49 == 0);
    pCVar22 = pCVar37;
    do {
      glu::CallLogWrapper::glDeleteProgram(this_00,pCVar22->name);
      pCVar22 = pCVar22 + 1;
      lVar38 = lVar38 + -1;
    } while (lVar38 != 0);
  }
  pCVar22 = pCVar37;
  if (pCVar7 != pCVar37) {
    do {
      puVar25 = (pCVar22->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (puVar25 != (pointer)0x0) {
        operator_delete(puVar25,(long)(pCVar22->stages).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)puVar25);
      }
      pCVar22 = pCVar22 + 1;
    } while (pCVar22 != pCVar7);
    programs.
    super__Vector_base<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
    ._M_impl.super__Vector_impl_data._M_finish = pCVar37;
  }
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&vbo);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,1,&vao);
  std::
  vector<glcts::(anonymous_namespace)::CompiledProgram,_std::allocator<glcts::(anonymous_namespace)::CompiledProgram>_>
  ::~vector(&programs);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)parentUniformName._M_dataplus._M_p != &parentUniformName.field_2) {
    operator_delete(parentUniformName._M_dataplus._M_p,
                    parentUniformName.field_2._M_allocated_capacity + 1);
  }
  return local_1688;
}

Assistant:

long doRun(std::vector<Uniform>& uniforms, std::vector<SubroutineUniform>& subroutineUniforms,
			   std::string additionalDef = "", bool negativeCompile = false, bool negativeLink = false)
	{
		long		ret				  = NO_ERROR;
		std::string parentUniformName = "";
		for (size_t i = 0; i < uniforms.size(); i++)
		{
			std::ostringstream name;
			name << "u" << i;
			uniforms[i].setName(parentUniformName, name.str());
		}
		int subroutineTypeCounter	 = 0;
		int subroutineFunctionCounter = 0;
		for (size_t i = 0; i < subroutineUniforms.size(); i++)
		{
			std::ostringstream name;
			name << "u" << i + uniforms.size();
			subroutineUniforms[i].setName(name.str());
			if (!subroutineUniforms[i].functions.getTypeName().size())
			{
				subroutineUniforms[i].functions.setTypeName(subroutineTypeCounter++);
				for (size_t fn = 0; fn < subroutineUniforms[i].functions.fn.size(); fn++)
				{
					subroutineUniforms[i].functions.fn[fn].setName(subroutineFunctionCounter++);
				}
			}
		}

		GLfloat coords[] = {
			1.0f, -1.0f, 0.0f, 1.0f, 1.0f, 1.0f, 0.0f, 1.0f, -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 1.0f, 0.0f, 1.0f,
		};

		GLuint vbo, vao;
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(coords), coords, GL_STATIC_DRAW);

		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, 0, NULL);
		glEnableVertexAttribArray(0);

		std::vector<CompiledProgram> programs;
		ret |= CreatePrograms(programs, uniforms, subroutineUniforms, additionalDef, negativeCompile, negativeLink);

		for (size_t i = 0; i < programs.size() && ret == NO_ERROR && !negativeCompile && !negativeLink; i++)
		{
			ret |= runExecuteProgram(programs[i], uniforms, subroutineUniforms);
			ret |= runQueryProgram(programs[i], uniforms, subroutineUniforms);
		}

		glUseProgram(0);

		DeletePrograms(programs);

		glDeleteBuffers(1, &vbo);
		glDeleteVertexArrays(1, &vao);

		return ret;
	}